

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp,OPJ_FLOAT64 *mct_norms
                            ,OPJ_UINT32 mct_numcomps)

{
  OPJ_INT32 *pOVar1;
  uint uVar2;
  opj_tcd_tilecomp_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_pass_t *poVar5;
  OPJ_UINT32 OVar6;
  OPJ_INT32 OVar7;
  opj_tcd_tile_t *poVar8;
  OPJ_BOOL OVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  byte bVar12;
  opj_tcd_tilecomp_t *poVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  OPJ_UINT32 OVar19;
  OPJ_INT16 *pOVar20;
  opj_flag_t *flagsp;
  int iVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  OPJ_UINT32 OVar25;
  opj_tcd_band_t *band;
  long lVar26;
  ulong uVar27;
  uint *puVar28;
  opj_mqc_state_t **ppoVar29;
  uint uVar30;
  opj_tcd_cblk_enc_t *poVar31;
  bool bVar32;
  float fVar33;
  double dVar34;
  OPJ_BYTE type;
  opj_mqc_t *mqc;
  OPJ_INT32 local_168;
  uint local_164;
  ulong local_160;
  OPJ_INT32 one;
  undefined4 uStack_154;
  char local_14e;
  byte local_14d;
  uint local_14c;
  int local_148;
  int local_144;
  ulong local_140;
  uint local_134;
  ulong local_130;
  opj_tcd_band_t *local_128;
  opj_tcd_tilecomp_t *local_120;
  OPJ_UINT32 local_118;
  OPJ_UINT32 local_114;
  opj_tcd_resolution_t *local_110;
  ulong local_108;
  opj_tcd_cblk_enc_t *local_100;
  ulong local_f8;
  uint local_ec;
  uint local_e8;
  OPJ_UINT32 local_e4;
  ulong local_e0;
  opj_tccp_t *local_d8;
  OPJ_FLOAT64 *local_d0;
  opj_tcd_tile_t *local_c8;
  double local_c0;
  opj_tcd_pass_t *local_b8;
  ulong local_b0;
  opj_mqc_state_t **local_a8;
  ulong local_a0;
  ulong local_98;
  opj_tcp_t *local_90;
  ulong local_88;
  opj_tcd_band_t *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  opj_tcd_precinct_t *local_60;
  ulong local_58;
  double local_50;
  long local_48;
  opj_mqc_state_t **local_40;
  opj_mqc_state_t **local_38;
  
  tile->distotile = 0.0;
  if (tile->numcomps != 0) {
    local_38 = (t1->mqc).ctxs + 0x11;
    local_40 = (t1->mqc).ctxs + 0x12;
    ppoVar29 = (t1->mqc).ctxs;
    local_98 = (ulong)mct_numcomps;
    local_108 = 0;
    local_d0 = mct_norms;
    local_c8 = tile;
    local_a8 = ppoVar29;
    local_90 = tcp;
    do {
      poVar3 = tile->comps;
      if (poVar3[local_108].numresolutions != 0) {
        poVar13 = poVar3 + local_108;
        local_ec = poVar3[local_108].x1 - poVar3[local_108].x0;
        local_d8 = local_90->tccps + local_108;
        local_68 = (ulong)local_ec;
        local_14e = local_108 < local_98 && local_d0 != (OPJ_FLOAT64 *)0x0;
        local_88 = 0;
        local_120 = poVar13;
        do {
          if (poVar13->resolutions[local_88].numbands != 0) {
            local_110 = poVar13->resolutions + local_88;
            local_80 = local_110->bands;
            local_e0 = (ulong)((uint)local_88 - 1);
            local_e8 = ~(uint)local_88;
            local_70 = 0;
            do {
              band = local_80 + local_70;
              OVar9 = opj_tcd_is_band_empty(band);
              iVar18 = 10;
              if ((OVar9 == 0) && (iVar18 = 0, local_128 = band, local_110->ph * local_110->pw != 0)
                 ) {
                fVar33 = floorf((float)band->stepsize * 8192.0);
                local_48 = (long)(int)(0x4000000 / (long)(int)fVar33);
                uVar16 = 0;
                do {
                  poVar4 = band->precincts;
                  local_78 = uVar16;
                  if (poVar4[uVar16].ch * poVar4[uVar16].cw != 0) {
                    local_60 = poVar4 + uVar16;
                    uVar16 = 0;
                    do {
                      poVar31 = (local_60->cblks).enc;
                      iVar18 = poVar31[uVar16].x0 - band->x0;
                      if ((band->bandno & 1) != 0) {
                        iVar18 = (iVar18 + local_120->resolutions[local_e0].x1) -
                                 local_120->resolutions[local_e0].x0;
                      }
                      iVar21 = poVar31[uVar16].y0 - band->y0;
                      if ((band->bandno & 2) != 0) {
                        iVar21 = (iVar21 + local_120->resolutions[local_e0].y1) -
                                 local_120->resolutions[local_e0].y0;
                      }
                      local_100 = poVar31 + uVar16;
                      local_58 = uVar16;
                      OVar9 = opj_t1_allocate_buffers
                                        (t1,local_100->x1 - poVar31[uVar16].x0,
                                         local_100->y1 - poVar31[uVar16].y0);
                      poVar31 = local_100;
                      if (OVar9 == 0) {
                        iVar18 = 1;
                        goto LAB_001284bb;
                      }
                      OVar19 = t1->w;
                      OVar11 = t1->h;
                      pOVar1 = local_120->data + (long)iVar21 * local_68 + (long)iVar18;
                      t1->data = pOVar1;
                      t1->data_stride = local_ec;
                      if (local_d8->qmfbid == 1) {
                        if (OVar11 != 0) {
                          lVar24 = 0;
                          OVar25 = 0;
                          OVar6 = OVar19;
                          do {
                            for (; OVar6 != 0; OVar6 = OVar6 - 1) {
                              pOVar1[lVar24] = pOVar1[lVar24] << 6;
                              lVar24 = lVar24 + 1;
                            }
                            lVar24 = lVar24 + (ulong)(local_ec - OVar19);
                            OVar25 = OVar25 + 1;
                            OVar6 = OVar19;
                          } while (OVar25 != OVar11);
                        }
                      }
                      else if (OVar11 != 0) {
                        lVar24 = 0;
                        OVar25 = 0;
                        OVar6 = OVar19;
                        do {
                          for (; OVar6 != 0; OVar6 = OVar6 - 1) {
                            lVar26 = pOVar1[lVar24] * local_48 + 0x1000 >> 0x12;
                            if (0x7fffffff < lVar26) {
                              __assert_fail("(temp >> (13 + 11 - T1_NMSEDEC_FRACBITS)) <= (OPJ_INT64)0x7FFFFFFF"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                            ,0x107,
                                            "OPJ_INT32 opj_int_fix_mul_t1(OPJ_INT32, OPJ_INT32)");
                            }
                            if (lVar26 < -0x80000000) {
                              __assert_fail("(temp >> (13 + 11 - T1_NMSEDEC_FRACBITS)) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1)"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                                            ,0x109,
                                            "OPJ_INT32 opj_int_fix_mul_t1(OPJ_INT32, OPJ_INT32)");
                            }
                            pOVar1[lVar24] = (OPJ_INT32)lVar26;
                            lVar24 = lVar24 + 1;
                          }
                          lVar24 = lVar24 + (ulong)(local_ec - OVar19);
                          OVar25 = OVar25 + 1;
                          OVar6 = OVar19;
                        } while (OVar25 != OVar11);
                      }
                      local_114 = local_128->bandno;
                      local_118 = local_120->numresolutions + local_e8;
                      local_130 = (ulong)local_d8->cblksty;
                      local_e4 = local_d8->qmfbid;
                      local_50 = (double)(float)local_128->stepsize;
                      local_168 = 0;
                      (t1->mqc).lut_ctxno_zc_orient = "" + (local_114 << 9);
                      uVar30 = 0;
                      if (t1->w != 0) {
                        uVar30 = 0;
                        uVar16 = 0;
                        do {
                          iVar18 = (int)uVar16;
                          if ((ulong)t1->h != 0) {
                            uVar27 = (ulong)t1->h;
                            do {
                              uVar22 = pOVar1[uVar16];
                              uVar14 = -uVar22;
                              if (0 < (int)uVar22) {
                                uVar14 = uVar22;
                              }
                              if ((int)uVar30 <= (int)uVar14) {
                                uVar30 = uVar14;
                              }
                              uVar16 = (ulong)((int)uVar16 + t1->data_stride);
                              uVar27 = uVar27 - 1;
                            } while (uVar27 != 0);
                          }
                          uVar22 = iVar18 + 1;
                          uVar16 = (ulong)uVar22;
                        } while (uVar22 != t1->w);
                      }
                      OVar19 = 0;
                      if ((uVar30 != 0) && (OVar19 = 0xfffffffb, 1 < (int)uVar30)) {
                        uVar16 = (ulong)uVar30;
                        do {
                          uVar16 = uVar16 >> 1;
                          OVar19 = OVar19 + 1;
                          bVar32 = 3 < uVar30;
                          uVar30 = (uint)uVar16;
                        } while (bVar32);
                      }
                      local_100->numbps = OVar19;
                      if (OVar19 == 0) {
                        local_100->totalpasses = 0;
                      }
                      else {
                        opj_mqc_resetstates(&t1->mqc);
                        opj_mqc_setstate(&t1->mqc,0x12,0,0x2e);
                        opj_mqc_setstate(&t1->mqc,0x11,0,3);
                        opj_mqc_setstate(&t1->mqc,0,0,4);
                        opj_mqc_init_enc(&t1->mqc,poVar31->data);
                        uVar30 = 0;
                        iVar18 = OVar19 - 1;
                        if (-1 < iVar18) {
                          local_14d = (byte)local_130 & 1;
                          local_f8 = (ulong)((uint)local_130 & 8);
                          local_134 = (uint)local_130 & 0x10;
                          local_14c = 2;
                          uVar16 = 0;
                          local_c0 = 0.0;
                          do {
                            uVar30 = local_14c;
                            local_b8 = poVar31->passes;
                            local_164 = (uint)local_14d;
                            if ((int)(poVar31->numbps - 4) <= iVar18) {
                              local_164 = 0;
                            }
                            if (1 < local_14c) {
                              local_164 = 0;
                            }
                            if (((int)uVar16 != 0) &&
                               ((local_b8[(int)uVar16 - 1].field_0x14 & 1) != 0)) {
                              if ((byte)local_164 == '\0') {
                                opj_mqc_restart_init_enc(&t1->mqc);
                              }
                              else {
                                opj_mqc_bypass_init_enc(&t1->mqc);
                              }
                            }
                            bVar12 = (byte)iVar18;
                            uVar22 = 0x40 << (bVar12 & 0x1f);
                            _one = (OPJ_FLOAT64)CONCAT44(uStack_154,uVar22);
                            local_b0 = uVar16;
                            if (uVar30 == 2) {
                              local_168 = 0;
                              uVar30 = t1->h;
                              uVar16 = 0;
                              if (3 < uVar30) {
                                uVar16 = 0;
                                do {
                                  uVar30 = t1->w;
                                  if (uVar30 != 0) {
                                    local_140 = (ulong)((int)(uVar16 >> 2) + 1);
                                    local_160 = uVar16;
                                    uVar14 = 0;
                                    do {
                                      iVar21 = (int)local_160;
                                      uVar10 = uVar14 + 1;
                                      iVar15 = (int)local_140;
                                      bVar32 = t1->flags[(uVar30 + 2) * iVar15 + uVar14 + 1] == 0;
                                      OVar19 = 0;
                                      if (bVar32) {
                                        uVar30 = iVar21 * t1->data_stride + uVar14;
                                        uVar16 = 0;
                                        do {
                                          uVar2 = t1->data[uVar30];
                                          uVar23 = -uVar2;
                                          if (0 < (int)uVar2) {
                                            uVar23 = uVar2;
                                          }
                                          if ((uVar23 & uVar22) != 0) goto LAB_00127d31;
                                          uVar16 = uVar16 + 1;
                                          uVar30 = uVar30 + t1->data_stride;
                                        } while (uVar16 != 4);
                                        uVar16 = 4;
LAB_00127d31:
                                        (t1->mqc).curctx = local_38;
                                        OVar19 = (OPJ_UINT32)uVar16;
                                        opj_mqc_encode(&t1->mqc,(uint)(OVar19 != 4));
                                        if (OVar19 != 4) {
                                          (t1->mqc).curctx = local_40;
                                          opj_mqc_encode(&t1->mqc,(uint)(uVar16 >> 1) & 0x7fffffff);
                                          opj_mqc_encode(&t1->mqc,OVar19 & 1);
                                          iVar21 = (int)local_160;
                                          iVar15 = (int)local_140;
                                          uVar22 = one;
                                          goto LAB_00127d9b;
                                        }
                                      }
                                      else {
LAB_00127d9b:
                                        opj_t1_enc_clnpass_step
                                                  (t1,t1->flags + ((t1->w + 2) * iVar15 + uVar10),
                                                   t1->data +
                                                   ((OVar19 + iVar21) * t1->data_stride + uVar14),
                                                   iVar18,uVar22,&local_168,(uint)bVar32,OVar19,4,
                                                   (OPJ_UINT32)local_130);
                                      }
                                      uVar30 = t1->w;
                                      uVar16 = local_160;
                                      uVar22 = one;
                                      uVar14 = uVar10;
                                    } while (uVar10 < uVar30);
                                  }
                                  uVar16 = uVar16 + 4;
                                  uVar30 = t1->h;
                                } while (uVar16 < (uVar30 & 0xfffffffc));
                              }
                              uVar27 = local_130;
                              uVar22 = (uint)uVar16;
                              if ((uVar22 < uVar30) && (uVar30 = t1->w, uVar30 != 0)) {
                                local_160 = CONCAT44(local_160._4_4_,
                                                     ((uint)(uVar16 >> 2) & 0x3fffffff) + 1);
                                uVar14 = 0;
                                do {
                                  uVar10 = uVar14 + 1;
                                  opj_t1_enc_clnpass_step
                                            (t1,t1->flags +
                                                (uVar14 + (uVar30 + 2) * (uint)local_160 + 1),
                                             t1->data + (t1->data_stride * uVar22 + uVar14),iVar18,
                                             one,&local_168,0,0,t1->h - uVar22,(OPJ_UINT32)uVar27);
                                  uVar30 = t1->w;
                                  uVar14 = uVar10;
                                } while (uVar10 < uVar30);
                              }
                              if ((uVar27 & 0x20) != 0) {
                                opj_mqc_segmark_enc(&t1->mqc);
                              }
                            }
                            else if (uVar30 == 1) {
                              puVar28 = t1->flags + (t1->w + 3);
                              local_168 = 0;
                              uVar30 = t1->h;
                              uVar16 = local_160 >> 0x20;
                              local_160 = uVar16 << 0x20;
                              if (3 < uVar30) {
                                pOVar20 = lut_nmsedec_ref;
                                if (iVar18 == 0) {
                                  pOVar20 = lut_nmsedec_ref0;
                                }
                                local_160 = uVar16 << 0x20;
                                local_140 = CONCAT44(local_140._4_4_,1);
                                local_144 = 2;
                                local_148 = 3;
                                do {
                                  if (t1->w != 0) {
                                    uVar30 = 0;
                                    do {
                                      uVar14 = *puVar28;
                                      if ((~uVar14 & 0x49200000) != 0 && (uVar14 & 0x2490) != 0) {
                                        if ((uVar14 & 0x200010) == 0x10) {
                                          uVar10 = t1->data[t1->data_stride * (uint)local_160 +
                                                            uVar30];
                                          uVar2 = -uVar10;
                                          if (0 < (int)uVar10) {
                                            uVar2 = uVar10;
                                          }
                                          local_168 = local_168 +
                                                      pOVar20[uVar2 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar16 = (ulong)(0xf - ((uVar14 & 0x1ef) == 0));
                                          if ((uVar14 >> 0x14 & 1) != 0) {
                                            uVar16 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar29 + uVar16;
                                          uVar22 = (uint)((uVar2 & uVar22) != 0);
                                          if ((byte)local_164 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar22);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar22);
                                          }
                                          *(byte *)((long)puVar28 + 2) =
                                               *(byte *)((long)puVar28 + 2) | 0x10;
                                          uVar22 = one;
                                        }
                                        uVar14 = *puVar28;
                                        if ((uVar14 & 0x1000080) == 0x80) {
                                          uVar10 = t1->data[t1->data_stride * (uint)local_140 +
                                                            uVar30];
                                          uVar2 = -uVar10;
                                          if (0 < (int)uVar10) {
                                            uVar2 = uVar10;
                                          }
                                          local_168 = local_168 +
                                                      pOVar20[uVar2 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar16 = (ulong)(0xf - ((uVar14 & 0xf78) == 0));
                                          if ((uVar14 >> 0x17 & 1) != 0) {
                                            uVar16 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar29 + uVar16;
                                          uVar22 = (uint)((uVar2 & uVar22) != 0);
                                          if ((byte)local_164 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar22);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar22);
                                          }
                                          *(byte *)((long)puVar28 + 2) =
                                               *(byte *)((long)puVar28 + 2) | 0x80;
                                          uVar22 = one;
                                        }
                                        uVar14 = *puVar28;
                                        if ((uVar14 & 0x8000400) == 0x400) {
                                          uVar10 = t1->data[t1->data_stride * local_144 + uVar30];
                                          uVar2 = -uVar10;
                                          if (0 < (int)uVar10) {
                                            uVar2 = uVar10;
                                          }
                                          local_168 = local_168 +
                                                      pOVar20[uVar2 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar10 = 0xf - ((uVar14 & 0x7bc0) == 0);
                                          if ((uVar14 >> 0x1a & 1) != 0) {
                                            uVar10 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar29 + uVar10;
                                          uVar22 = (uint)((uVar2 & uVar22) != 0);
                                          if ((byte)local_164 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar22);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar22);
                                          }
                                          *(byte *)((long)puVar28 + 3) =
                                               *(byte *)((long)puVar28 + 3) | 4;
                                          uVar22 = one;
                                        }
                                        uVar14 = *puVar28;
                                        if ((uVar14 & 0x40002000) == 0x2000) {
                                          uVar10 = t1->data[t1->data_stride * local_148 + uVar30];
                                          uVar2 = -uVar10;
                                          if (0 < (int)uVar10) {
                                            uVar2 = uVar10;
                                          }
                                          local_168 = local_168 +
                                                      pOVar20[uVar2 >> (bVar12 & 0x1f) & 0x7f];
                                          uVar10 = 0xf - ((uVar14 & 0x3de00) == 0);
                                          if ((uVar14 >> 0x1d & 1) != 0) {
                                            uVar10 = 0x10;
                                          }
                                          (t1->mqc).curctx = ppoVar29 + uVar10;
                                          uVar22 = (uint)((uVar2 & uVar22) != 0);
                                          if ((byte)local_164 == '\0') {
                                            opj_mqc_encode(&t1->mqc,uVar22);
                                          }
                                          else {
                                            opj_mqc_bypass_enc(&t1->mqc,uVar22);
                                          }
                                          *(byte *)((long)puVar28 + 3) =
                                               *(byte *)((long)puVar28 + 3) | 0x20;
                                          uVar22 = one;
                                        }
                                      }
                                      puVar28 = puVar28 + 1;
                                      uVar30 = uVar30 + 1;
                                    } while (uVar30 < t1->w);
                                  }
                                  puVar28 = puVar28 + 2;
                                  uVar14 = (uint)local_160 + 4;
                                  uVar30 = t1->h;
                                  local_140 = CONCAT44(local_140._4_4_,(uint)local_140 + 4);
                                  local_144 = local_144 + 4;
                                  local_148 = local_148 + 4;
                                  local_160 = CONCAT44(local_160._4_4_,uVar14);
                                } while (uVar14 < (uVar30 & 0xfffffffc));
                              }
                              if (((uint)local_160 < uVar30) && (t1->w != 0)) {
                                pOVar20 = lut_nmsedec_ref;
                                if (iVar18 == 0) {
                                  pOVar20 = lut_nmsedec_ref0;
                                }
                                uVar30 = 0;
                                do {
                                  if (((*puVar28 & 0x2490) != 0) && ((uint)local_160 < t1->h)) {
                                    bVar17 = 0;
                                    uVar14 = (uint)local_160;
                                    do {
                                      uVar10 = *puVar28 >> (bVar17 & 0x1f);
                                      if ((uVar10 & 0x200010) == 0x10) {
                                        uVar2 = t1->data[t1->data_stride * uVar14 + uVar30];
                                        uVar23 = -uVar2;
                                        if (0 < (int)uVar2) {
                                          uVar23 = uVar2;
                                        }
                                        local_168 = local_168 +
                                                    pOVar20[uVar23 >> (bVar12 & 0x1f) & 0x7f];
                                        uVar2 = 0xf - ((uVar10 & 0x1ef) == 0);
                                        if ((uVar10 >> 0x14 & 1) != 0) {
                                          uVar2 = 0x10;
                                        }
                                        (t1->mqc).curctx = local_a8 + uVar2;
                                        uVar22 = (uint)((uVar23 & uVar22) != 0);
                                        if ((byte)local_164 == '\0') {
                                          opj_mqc_encode(&t1->mqc,uVar22);
                                        }
                                        else {
                                          opj_mqc_bypass_enc(&t1->mqc,uVar22);
                                        }
                                        *puVar28 = *puVar28 | 0x100000 << (bVar17 & 0x1f);
                                        uVar22 = one;
                                      }
                                      uVar14 = uVar14 + 1;
                                      bVar17 = bVar17 + 3;
                                    } while (uVar14 < t1->h);
                                  }
                                  puVar28 = puVar28 + 1;
                                  uVar30 = uVar30 + 1;
                                } while (uVar30 < t1->w);
                              }
                            }
                            else {
                              flagsp = t1->flags + (t1->w + 3);
                              local_168 = 0;
                              uVar30 = t1->h;
                              uVar16 = 0;
                              local_a0 = (ulong)(byte)local_164;
                              if (3 < uVar30) {
                                uVar16 = 0;
                                local_140 = CONCAT44(local_140._4_4_,3);
                                local_144 = 2;
                                local_148 = 1;
                                do {
                                  if (t1->w != 0) {
                                    uVar30 = 0;
                                    local_160 = uVar16;
                                    do {
                                      if (*flagsp != 0) {
                                        type = (OPJ_BYTE)local_a0;
                                        opj_t1_enc_sigpass_step
                                                  (t1,flagsp,
                                                   t1->data +
                                                   (t1->data_stride * (int)uVar16 + uVar30),iVar18,
                                                   one,&local_168,type,0,(OPJ_UINT32)local_f8);
                                        opj_t1_enc_sigpass_step
                                                  (t1,flagsp,
                                                   t1->data + (t1->data_stride * local_148 + uVar30)
                                                   ,iVar18,one,&local_168,type,1,0);
                                        opj_t1_enc_sigpass_step
                                                  (t1,flagsp,
                                                   t1->data + (t1->data_stride * local_144 + uVar30)
                                                   ,iVar18,one,&local_168,type,2,0);
                                        opj_t1_enc_sigpass_step
                                                  (t1,flagsp,
                                                   t1->data +
                                                   (t1->data_stride * (uint)local_140 + uVar30),
                                                   iVar18,one,&local_168,type,3,0);
                                        uVar16 = local_160;
                                      }
                                      flagsp = flagsp + 1;
                                      uVar30 = uVar30 + 1;
                                    } while (uVar30 < t1->w);
                                  }
                                  flagsp = flagsp + 2;
                                  uVar22 = (int)uVar16 + 4;
                                  uVar16 = (ulong)uVar22;
                                  uVar30 = t1->h;
                                  local_140 = CONCAT44(local_140._4_4_,(uint)local_140 + 4);
                                  local_144 = local_144 + 4;
                                  local_148 = local_148 + 4;
                                } while (uVar22 < (uVar30 & 0xfffffffc));
                              }
                              if (((uint)uVar16 < uVar30) && (t1->w != 0)) {
                                uVar30 = 0;
                                local_160 = uVar16;
                                do {
                                  uVar27 = local_a0;
                                  if ((*flagsp != 0) && ((uint)uVar16 < t1->h)) {
                                    OVar19 = 0;
                                    local_140 = CONCAT44(local_140._4_4_,uVar30);
                                    do {
                                      opj_t1_enc_sigpass_step
                                                (t1,flagsp,
                                                 t1->data +
                                                 (((int)uVar16 + OVar19) * t1->data_stride + uVar30)
                                                 ,iVar18,one,&local_168,(OPJ_BYTE)uVar27,OVar19,
                                                 (uint)(OVar19 == 0 && (int)local_f8 != 0));
                                      iVar21 = (int)local_160 + OVar19;
                                      OVar19 = OVar19 + 1;
                                      uVar16 = local_160;
                                      uVar30 = (uint)local_140;
                                    } while (iVar21 + 1U < t1->h);
                                  }
                                  flagsp = flagsp + 1;
                                  uVar30 = uVar30 + 1;
                                } while (uVar30 < t1->w);
                              }
                            }
                            poVar8 = local_c8;
                            OVar7 = local_168;
                            _one = 1.0;
                            if (local_14e != '\0') {
                              _one = local_d0[local_108];
                            }
                            if (local_e4 == 1) {
                              dVar34 = (double)opj_dwt_getnorm(local_118,local_114);
                            }
                            else {
                              dVar34 = (double)opj_dwt_getnorm_real(local_118,local_114);
                            }
                            poVar5 = local_b8 + (local_b0 & 0xffffffff);
                            dVar34 = (double)(1 << (bVar12 & 0x1f)) *
                                     (double)_one * dVar34 * local_50;
                            dVar34 = (double)OVar7 * dVar34 * 0.0001220703125 * dVar34;
                            local_c0 = local_c0 + dVar34;
                            poVar8->distotile = (OPJ_FLOAT64)(dVar34 + (double)poVar8->distotile);
                            poVar5->distortiondec = (OPJ_FLOAT64)local_c0;
                            if ((((local_130 & 4) == 0) && (local_14c != 2 || iVar18 != 0)) &&
                               (((local_130 & 1) == 0 ||
                                (((iVar21 = local_100->numbps - 4, local_14c != 2 ||
                                  (iVar21 != iVar18)) && ((local_14c == 0 || (iVar21 <= iVar18))))))
                               )) {
                              if ((byte)local_164 == '\0') {
                                OVar11 = 3;
                              }
                              else {
                                OVar11 = opj_mqc_bypass_get_extra_bytes(&t1->mqc,local_134);
                              }
                              poVar5->field_0x14 = poVar5->field_0x14 & 0xfe;
                              OVar19 = opj_mqc_numbytes(&t1->mqc);
                              OVar19 = OVar19 + OVar11;
                            }
                            else {
                              if ((byte)local_164 == '\0') {
                                if (local_134 == 0) {
                                  opj_mqc_flush(&t1->mqc);
                                }
                                else {
                                  opj_mqc_erterm_enc(&t1->mqc);
                                }
                              }
                              else {
                                opj_mqc_bypass_flush_enc(&t1->mqc,local_134);
                              }
                              poVar5->field_0x14 = poVar5->field_0x14 | 1;
                              OVar19 = opj_mqc_numbytes(&t1->mqc);
                            }
                            local_14c = local_14c + 1;
                            bVar32 = local_14c == 3;
                            if (bVar32) {
                              local_14c = 0;
                            }
                            poVar5->rate = OVar19;
                            if ((local_130 & 2) != 0) {
                              opj_mqc_reset_enc(&t1->mqc);
                            }
                            iVar18 = iVar18 - (uint)bVar32;
                            uVar30 = (int)local_b0 + 1;
                            uVar16 = (ulong)uVar30;
                            ppoVar29 = local_a8;
                            poVar31 = local_100;
                          } while (-1 < iVar18);
                        }
                        poVar31->totalpasses = uVar30;
                        if (uVar30 != 0) {
                          uVar30 = opj_mqc_numbytes(&t1->mqc);
                          if ((ulong)poVar31->totalpasses != 0) {
                            poVar5 = poVar31->passes;
                            lVar24 = (ulong)poVar31->totalpasses * 0x18;
                            do {
                              uVar22 = *(uint *)((long)&poVar5[-1].rate + lVar24);
                              if (uVar30 < uVar22) {
                                *(uint *)((long)&poVar5[-1].rate + lVar24) = uVar30;
                                uVar22 = uVar30;
                              }
                              uVar30 = uVar22;
                              lVar24 = lVar24 + -0x18;
                            } while (lVar24 != 0);
                          }
                        }
                        uVar30 = poVar31->totalpasses;
                        if ((ulong)uVar30 != 0) {
                          poVar5 = poVar31->passes;
                          lVar24 = 0;
                          do {
                            iVar18 = *(int *)((long)&poVar5->rate + lVar24);
                            if (iVar18 == 0) {
                              __assert_fail("pass->rate > 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/t1.c"
                                            ,0x966,
                                            "void opj_t1_encode_cblk(opj_t1_t *, opj_tcd_cblk_enc_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_FLOAT64, OPJ_UINT32, OPJ_UINT32, opj_tcd_tile_t *, const OPJ_FLOAT64 *, OPJ_UINT32)"
                                           );
                            }
                            uVar22 = iVar18 - 1;
                            if (poVar31->data[uVar22] == 0xff) {
                              *(uint *)((long)&poVar5->rate + lVar24) = uVar22;
                            }
                            if (lVar24 == 0) {
                              iVar18 = 0;
                            }
                            else {
                              iVar18 = *(int *)((long)&poVar5[-1].rate + lVar24);
                            }
                            *(int *)((long)&poVar5->len + lVar24) =
                                 *(int *)((long)&poVar5->rate + lVar24) - iVar18;
                            lVar24 = lVar24 + 0x18;
                          } while ((ulong)uVar30 * 0x18 != lVar24);
                        }
                      }
                      uVar16 = local_58 + 1;
                      band = local_128;
                    } while (uVar16 < local_60->ch * local_60->cw);
                  }
                  uVar16 = local_78 + 1;
                } while (uVar16 < local_110->ph * local_110->pw);
                iVar18 = 0;
              }
LAB_001284bb:
              if ((iVar18 != 10) && (iVar18 != 0)) goto LAB_001284ea;
              local_70 = local_70 + 1;
            } while (local_70 < local_110->numbands);
            iVar18 = 0;
LAB_001284ea:
            poVar13 = local_120;
            tile = local_c8;
            if (iVar18 != 0) {
              return 0;
            }
          }
          local_88 = local_88 + 1;
        } while (local_88 < poVar13->numresolutions);
      }
      local_108 = local_108 + 1;
    } while (local_108 < tile->numcomps);
  }
  return 1;
}

Assistant:

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,
                             opj_tcd_tile_t *tile,
                             opj_tcp_t *tcp,
                             const OPJ_FLOAT64 * mct_norms,
                             OPJ_UINT32 mct_numcomps
                            )
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;

    tile->distotile = 0;        /* fixed_quality */

    for (compno = 0; compno < tile->numcomps; ++compno) {
        opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
        opj_tccp_t* tccp = &tcp->tccps[compno];
        OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

        for (resno = 0; resno < tilec->numresolutions; ++resno) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; ++bandno) {
                opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];
                OPJ_INT32 bandconst;

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                bandconst = 8192 * 8192 / ((OPJ_INT32) floor(band->stepsize * 8192));
                for (precno = 0; precno < res->pw * res->ph; ++precno) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
                        opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
                        OPJ_INT32* OPJ_RESTRICT tiledp;
                        OPJ_UINT32 cblk_w;
                        OPJ_UINT32 cblk_h;
                        OPJ_UINT32 i, j, tileLineAdvance;
                        OPJ_SIZE_T tileIndex = 0;

                        OPJ_INT32 x = cblk->x0 - band->x0;
                        OPJ_INT32 y = cblk->y0 - band->y0;
                        if (band->bandno & 1) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            x += pres->x1 - pres->x0;
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            y += pres->y1 - pres->y0;
                        }

                        if (!opj_t1_allocate_buffers(
                                    t1,
                                    (OPJ_UINT32)(cblk->x1 - cblk->x0),
                                    (OPJ_UINT32)(cblk->y1 - cblk->y0))) {
                            return OPJ_FALSE;
                        }

                        cblk_w = t1->w;
                        cblk_h = t1->h;
                        tileLineAdvance = tile_w - cblk_w;

                        tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w + (OPJ_SIZE_T)x];
                        t1->data = tiledp;
                        t1->data_stride = tile_w;
                        if (tccp->qmfbid == 1) {
                            /* Do multiplication on unsigned type, even if the
                             * underlying type is signed, to avoid potential
                             * int overflow on large value (the output will be
                             * incorrect in such situation, but whatever...)
                             * This assumes complement-to-2 signed integer
                             * representation
                             * Fixes https://github.com/uclouvain/openjpeg/issues/1053
                             */
                            OPJ_UINT32* OPJ_RESTRICT tiledp_u = (OPJ_UINT32*) tiledp;
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    tiledp_u[tileIndex] <<= T1_NMSEDEC_FRACBITS;
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        } else {        /* if (tccp->qmfbid == 0) */
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    OPJ_INT32 tmp = tiledp[tileIndex];
                                    tiledp[tileIndex] =
                                        opj_int_fix_mul_t1(
                                            tmp,
                                            bandconst);
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        }

                        opj_t1_encode_cblk(
                            t1,
                            cblk,
                            band->bandno,
                            compno,
                            tilec->numresolutions - 1 - resno,
                            tccp->qmfbid,
                            band->stepsize,
                            tccp->cblksty,
                            tile->numcomps,
                            tile,
                            mct_norms,
                            mct_numcomps);

                    } /* cblkno */
                } /* precno */
            } /* bandno */
        } /* resno  */
    } /* compno  */
    return OPJ_TRUE;
}